

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall CClient::AutoScreenshot_Cleanup(CClient *this)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  CFileCollection AutoScreens;
  
  AutoScreens.m_aTimestamps[0x240] = 0;
  AutoScreens.m_aTimestamps[0x40] = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_AutoScreenshotRecycle == true) {
    iVar1 = this->m_pConfig->m_ClAutoScreenshotMax;
    if (iVar1 != 0) {
      CFileCollection::Init
                (&AutoScreens,this->m_pStorage,"screenshots/auto","autoscreen",".png",iVar1);
    }
    this->m_AutoScreenshotRecycle = false;
  }
  if (this->m_AutoStatScreenshotRecycle == true) {
    iVar1 = this->m_pConfig->m_ClAutoScreenshotMax;
    if (iVar1 != 0) {
      CFileCollection::Init(&AutoScreens,this->m_pStorage,"screenshots/auto","stat",".png",iVar1);
    }
    this->m_AutoStatScreenshotRecycle = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::AutoScreenshot_Cleanup()
{
	if(m_AutoScreenshotRecycle)
	{
		if(Config()->m_ClAutoScreenshotMax)
		{
			// clean up auto taken screens
			CFileCollection AutoScreens;
			AutoScreens.Init(Storage(), "screenshots/auto", "autoscreen", ".png", Config()->m_ClAutoScreenshotMax);
		}
		m_AutoScreenshotRecycle = false;
	}
	if(m_AutoStatScreenshotRecycle)
	{
		if(Config()->m_ClAutoScreenshotMax)
		{
			// clean up auto taken stat screens
			CFileCollection AutoScreens;
			AutoScreens.Init(Storage(), "screenshots/auto", "stat", ".png", Config()->m_ClAutoScreenshotMax);
		}
		m_AutoStatScreenshotRecycle = false;
	}
}